

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::StreamingReporterBase::~StreamingReporterBase(StreamingReporterBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}